

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp9_header_parser.cc
# Opt level: O2

void __thiscall vp9_parser::Vp9HeaderParser::ParseTileInfo(Vp9HeaderParser *this)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  int iVar4;
  bool bVar5;
  
  iVar4 = 2;
  VpxReadLiteral(this,2);
  VpxReadLiteral(this,6);
  VpxReadLiteral(this,3);
  iVar1 = ReadBit(this);
  if ((iVar1 != 0) && (iVar1 = ReadBit(this), iVar1 != 0)) {
    iVar1 = 4;
    while (bVar5 = iVar1 != 0, iVar1 = iVar1 + -1, bVar5) {
      iVar2 = ReadBit(this);
      if (iVar2 != 0) {
        VpxReadLiteral(this,7);
      }
    }
    while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
      iVar1 = ReadBit(this);
      if (iVar1 != 0) {
        VpxReadLiteral(this,7);
      }
    }
  }
  VpxReadLiteral(this,8);
  SkipDeltaQ(this);
  SkipDeltaQ(this);
  SkipDeltaQ(this);
  iVar4 = ReadBit(this);
  if (iVar4 == 0) {
    iVar1 = (this->width_ + 7 >> 3) + 7 >> 3;
    iVar4 = -1;
    do {
      iVar4 = iVar4 + 1;
    } while (3 < iVar1 >> ((byte)iVar4 & 0x1f));
    iVar2 = 0;
    do {
      bVar3 = (byte)iVar2;
      iVar2 = iVar2 + 1;
    } while (0x40 << (bVar3 & 0x1f) < iVar1);
    if (iVar4 < 2) {
      iVar4 = 1;
    }
    iVar2 = 1 - iVar2;
    while ((iVar4 + iVar2 != 1 && (iVar1 = ReadBit(this), iVar1 != 0))) {
      iVar2 = iVar2 + -1;
    }
    iVar4 = ReadBit(this);
    if (iVar4 == 0) {
      bVar3 = 0;
    }
    else {
      iVar4 = ReadBit(this);
      bVar3 = (char)iVar4 + 1;
    }
    this->row_tiles_ = 1 << (bVar3 & 0x1f);
    this->column_tiles_ = 1 << (-(char)iVar2 & 0x1fU);
  }
  return;
}

Assistant:

void Vp9HeaderParser::ParseTileInfo() {
  VpxReadLiteral(2);  // Consume frame context index

  // loopfilter
  VpxReadLiteral(6);  // Consume filter level
  VpxReadLiteral(3);  // Consume sharpness level

  const bool mode_ref_delta_enabled = ReadBit();
  if (mode_ref_delta_enabled) {
    const bool mode_ref_delta_update = ReadBit();
    if (mode_ref_delta_update) {
      const int kMaxRefLFDeltas = 4;
      for (int i = 0; i < kMaxRefLFDeltas; ++i) {
        if (ReadBit())
          VpxReadLiteral(7);  // Consume ref_deltas + sign
      }

      const int kMaxModeDeltas = 2;
      for (int i = 0; i < kMaxModeDeltas; ++i) {
        if (ReadBit())
          VpxReadLiteral(7);  // Consume mode_delta + sign
      }
    }
  }

  // quantization
  VpxReadLiteral(8);  // Consume base_q
  SkipDeltaQ();  // y dc
  SkipDeltaQ();  // uv ac
  SkipDeltaQ();  // uv dc

  // segmentation
  const bool segmentation_enabled = ReadBit();
  if (!segmentation_enabled) {
    const int aligned_width = AlignPowerOfTwo(width_, kMiSizeLog2);
    const int mi_cols = aligned_width >> kMiSizeLog2;
    const int aligned_mi_cols = AlignPowerOfTwo(mi_cols, kMiSizeLog2);
    const int sb_cols = aligned_mi_cols >> 3;  // to_sbs(mi_cols);
    int min_log2_n_tiles, max_log2_n_tiles;

    for (max_log2_n_tiles = 0;
         (sb_cols >> max_log2_n_tiles) >= kMinTileWidthB64;
         max_log2_n_tiles++) {
    }
    max_log2_n_tiles--;
    if (max_log2_n_tiles < 0)
      max_log2_n_tiles = 0;

    for (min_log2_n_tiles = 0; (kMaxTileWidthB64 << min_log2_n_tiles) < sb_cols;
         min_log2_n_tiles++) {
    }

    // columns
    const int max_log2_tile_cols = max_log2_n_tiles;
    const int min_log2_tile_cols = min_log2_n_tiles;
    int max_ones = max_log2_tile_cols - min_log2_tile_cols;
    int log2_tile_cols = min_log2_tile_cols;
    while (max_ones-- && ReadBit())
      log2_tile_cols++;

    // rows
    int log2_tile_rows = ReadBit();
    if (log2_tile_rows)
      log2_tile_rows += ReadBit();

    row_tiles_ = 1 << log2_tile_rows;
    column_tiles_ = 1 << log2_tile_cols;
  }
}